

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfscursor.cpp
# Opt level: O2

void __thiscall QEglFSCursor::changeCursor(QEglFSCursor *this,QCursor *cursor,QWindow *window)

{
  bool bVar1;
  long in_FS_OFFSET;
  QRect local_48;
  QRect local_38;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = cursorRect(this);
  bVar1 = setCurrentCursor(this,cursor);
  if (bVar1) {
    local_48 = cursorRect(this);
    local_38 = (QRect)QRect::operator|(&local_28,&local_48);
    update(this,&local_38,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSCursor::changeCursor(QCursor *cursor, QWindow *window)
{
    Q_UNUSED(window);
    const QRect oldCursorRect = cursorRect();
    if (setCurrentCursor(cursor))
        update(oldCursorRect | cursorRect(), false);
}